

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_CREATE *deviceCreateInfo,IOTHUB_DEVICE *deviceInfo)

{
  LOGGER_LOG p_Var1;
  undefined1 local_108 [8];
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE deviceOrModuleCreateInfo;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE *deviceInfo_local;
  IOTHUB_REGISTRY_DEVICE_CREATE *deviceCreateInfo_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      (deviceCreateInfo == (IOTHUB_REGISTRY_DEVICE_CREATE *)0x0)) ||
     (deviceInfo == (IOTHUB_DEVICE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_CreateDevice",0x5c5,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    memset(local_108,0,0xa0);
    memset(&deviceOrModuleInfo.managedBy,0,0x38);
    deviceOrModuleInfo.managedBy._0_4_ = 0;
    l._4_4_ = IoTHubRegistryManager_CreateDeviceOrModule
                        (registryManagerHandle,
                         (IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *)&deviceOrModuleInfo.managedBy,
                         (IOTHUB_DEVICE_OR_MODULE *)local_108);
    if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
      move_deviceOrModule_members_to_device((IOTHUB_DEVICE_OR_MODULE *)local_108,deviceInfo);
      free_nonDevice_members_from_deviceOrModule((IOTHUB_DEVICE_OR_MODULE *)local_108);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_CREATE* deviceCreateInfo, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceCreateInfo == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE deviceOrModuleCreateInfo;
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;

        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));
        memset(&deviceOrModuleCreateInfo, 0, sizeof(deviceOrModuleCreateInfo));
        deviceOrModuleCreateInfo.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
        deviceOrModuleCreateInfo.deviceId = deviceCreateInfo->deviceId;
        deviceOrModuleCreateInfo.primaryKey = deviceCreateInfo->primaryKey;
        deviceOrModuleCreateInfo.secondaryKey = deviceCreateInfo->secondaryKey;
        deviceOrModuleCreateInfo.authMethod = deviceCreateInfo->authMethod;
        deviceOrModuleCreateInfo.iotEdge_capable = false; //IOTHUB_DEVICE does not have this field, so set it to disabled

        result = IoTHubRegistryManager_CreateDeviceOrModule(registryManagerHandle, &deviceOrModuleCreateInfo, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}